

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::writePad(QPDFWriter *this,size_t nspaces)

{
  allocator<char> local_49;
  string local_48 [32];
  string_view local_28;
  size_t local_18;
  size_t nspaces_local;
  QPDFWriter *this_local;
  
  local_18 = nspaces;
  nspaces_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,nspaces,' ',&local_49);
  local_28 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  writeString(this,local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void
QPDFWriter::writePad(size_t nspaces)
{
    writeString(std::string(nspaces, ' '));
}